

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

CloudNode * Cloud_bddAnd(CloudManager *dd,CloudNode *f,CloudNode *g)

{
  CloudNode *g_local;
  CloudNode *f_local;
  CloudManager *dd_local;
  
  if ((((ulong)f & 0xfffffffffffffffe) == 0) || (((ulong)g & 0xfffffffffffffffe) == 0)) {
    dd_local = (CloudManager *)0x0;
  }
  else {
    if ((f < dd->tUnique) || (dd->tUnique + dd->nNodesAlloc <= f)) {
      __assert_fail("(f) >= dd->tUnique && (f) < dd->tUnique+dd->nNodesAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                    ,0x1ed,"CloudNode *Cloud_bddAnd(CloudManager *, CloudNode *, CloudNode *)");
    }
    if ((g < dd->tUnique) || (dd->tUnique + dd->nNodesAlloc <= g)) {
      __assert_fail("(g) >= dd->tUnique && (g) < dd->tUnique+dd->nNodesAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                    ,0x1ee,"CloudNode *Cloud_bddAnd(CloudManager *, CloudNode *, CloudNode *)");
    }
    if (dd->tCaches[0] == (CloudCacheEntry2 *)0x0) {
      cloudCacheAllocate(dd,CLOUD_OPER_AND);
    }
    dd_local = (CloudManager *)cloudBddAnd_gate(dd,f,g);
  }
  return (CloudNode *)dd_local;
}

Assistant:

CloudNode * Cloud_bddAnd( CloudManager * dd, CloudNode * f, CloudNode * g )
{
    if ( Cloud_Regular(f) == NULL || Cloud_Regular(g) == NULL )
        return NULL;
    CLOUD_ASSERT(f);
    CLOUD_ASSERT(g);
    if ( dd->tCaches[CLOUD_OPER_AND] == NULL )
        cloudCacheAllocate( dd, CLOUD_OPER_AND );
    return cloudBddAnd_gate( dd, f, g );
}